

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O1

void __thiscall CVmSrcfTable::clear(CVmSrcfTable *this)

{
  CVmSrcfEntry *this_00;
  ulong uVar1;
  
  if (this->list_used_ != 0) {
    uVar1 = 0;
    do {
      this_00 = this->list_[uVar1];
      if (this_00 != (CVmSrcfEntry *)0x0) {
        CVmSrcfEntry::~CVmSrcfEntry(this_00);
        operator_delete(this_00,0x28);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->list_used_);
  }
  this->list_used_ = 0;
  return;
}

Assistant:

void CVmSrcfTable::clear()
{
    size_t i;
    
    /* delete each entry */
    for (i = 0 ; i < list_used_ ; ++i)
        delete(list_[i]);

    /* 
     *   we no longer have any entries, but leave the list allocated in
     *   case we add entries again 
     */
    list_used_ = 0;
}